

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::dequantize_int32_to_float32
               (Mat *m,float scale,float *bias,int bias_data_size,Option *opt)

{
  Layer *pLVar1;
  undefined8 in_RCX;
  int in_EDX;
  void *in_RSI;
  undefined8 in_RDI;
  float in_XMM0_Da;
  Mat weights [1];
  ParamDict pd;
  Layer *dequantize;
  Mat *in_stack_fffffffffffff5a8;
  Mat *in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b8;
  int in_stack_fffffffffffff5bc;
  ParamDict *in_stack_fffffffffffff5c0;
  Mat *local_a18;
  ParamDict *in_stack_fffffffffffff5f0;
  Mat *local_9e8;
  undefined1 local_9d8 [16];
  Mat local_9c8;
  Mat local_988;
  undefined1 auStack_948 [2328];
  Layer *local_30;
  undefined8 local_28;
  int local_1c;
  void *local_18;
  float local_c;
  undefined8 local_8;
  
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  local_8 = in_RDI;
  local_30 = create_layer(in_stack_fffffffffffff5bc);
  ParamDict::ParamDict(in_stack_fffffffffffff5f0);
  ParamDict::set((ParamDict *)(auStack_948 + 0x18),0,local_c);
  ParamDict::set((ParamDict *)(auStack_948 + 0x18),1,(uint)(local_18 != (void *)0x0));
  ParamDict::set((ParamDict *)(auStack_948 + 0x18),2,local_1c);
  (*local_30->_vptr_Layer[2])(local_30,auStack_948 + 0x18);
  local_9e8 = &local_988;
  do {
    Mat::Mat(local_9e8);
    local_9e8 = local_9e8 + 1;
  } while (local_9e8 != (Mat *)auStack_948);
  Mat::Mat(&local_9c8,local_1c,local_18,4,(Allocator *)0x0);
  Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                 in_stack_fffffffffffff5b0);
  Mat::~Mat((Mat *)0x15be98);
  pLVar1 = local_30;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  (*pLVar1->_vptr_Layer[3])(pLVar1,local_9d8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x15bee1);
  (*local_30->_vptr_Layer[4])(local_30,local_28);
  (*local_30->_vptr_Layer[9])(local_30,local_8,local_28);
  (*local_30->_vptr_Layer[5])(local_30,local_28);
  if (local_30 != (Layer *)0x0) {
    (*local_30->_vptr_Layer[1])();
  }
  local_a18 = (Mat *)auStack_948;
  do {
    local_a18 = local_a18 + -1;
    Mat::~Mat((Mat *)0x15bf81);
  } while (local_a18 != &local_988);
  ParamDict::~ParamDict(in_stack_fffffffffffff5c0);
  return;
}

Assistant:

void dequantize_int32_to_float32(Mat& m, float scale, const float* bias, int bias_data_size, const Option& opt)
{
    Layer* dequantize = create_layer(LayerType::Dequantize);

    ParamDict pd;
    pd.set(0, scale);
    pd.set(1, bias ? 1 : 0);
    pd.set(2, bias_data_size);

    dequantize->load_param(pd);

    Mat weights[1];
    weights[0] = Mat(bias_data_size, (void*)bias);

    dequantize->load_model(ModelBinFromMatArray(weights));

    dequantize->create_pipeline(opt);

    dequantize->forward_inplace(m, opt);

    dequantize->destroy_pipeline(opt);

    delete dequantize;
}